

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::ArrowButtonEx(char *str_id,ImGuiDir dir,ImVec2 size,ImGuiButtonFlags flags)

{
  ImGuiWindow *this;
  ImVec2 pos;
  ImVec2 p_min;
  ImVec2 p_max;
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  ImGuiID id;
  ImU32 fill_col;
  ImU32 IVar4;
  int iVar5;
  ImGuiCol idx;
  float fVar6;
  float fVar7;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  bool held;
  bool hovered;
  ImRect bb;
  bool local_72;
  bool local_71;
  ImVec2 local_70;
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  ImRect local_40;
  
  pIVar1 = GImGui;
  local_58 = size.y;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    local_68._8_4_ = in_XMM0_Dc;
    local_68._0_8_ = size;
    local_68._12_4_ = in_XMM0_Dd;
    local_70 = size;
    fStack_54 = local_58;
    fStack_50 = local_58;
    fStack_4c = local_58;
    id = ImGuiWindow::GetID(this,str_id,(char *)0x0);
    local_40.Min.x = (this->DC).CursorPos.x;
    local_40.Min.y = (this->DC).CursorPos.y;
    local_40.Max.x = (float)local_68._0_4_ + local_40.Min.x;
    local_40.Max.y = (float)local_68._4_4_ + local_40.Min.y;
    fVar6 = GetFrameHeight();
    if (fVar6 <= local_58) {
      fVar6 = (pIVar1->Style).FramePadding.y;
    }
    else {
      fVar6 = -1.0;
    }
    ItemSize(&local_70,fVar6);
    bVar3 = false;
    bVar2 = ItemAdd(&local_40,id,(ImRect *)0x0);
    if (bVar2) {
      local_58 = (float)dir;
      bVar3 = ButtonBehavior(&local_40,id,&local_71,&local_72,
                             ((this->DC).ItemFlags & 2U) << 9 | flags);
      iVar5 = ((local_72 ^ 1U) & local_71) + 0x15;
      idx = 0x17;
      if ((local_71 & 1U) == 0) {
        idx = iVar5;
      }
      if (local_72 == false) {
        idx = iVar5;
      }
      fill_col = GetColorU32(idx,1.0);
      IVar4 = GetColorU32(0,1.0);
      local_68._0_4_ = IVar4;
      RenderNavHighlight(&local_40,id,1);
      p_min.y = local_40.Min.y;
      p_min.x = local_40.Min.x;
      p_max.y = local_40.Max.y;
      p_max.x = local_40.Max.x;
      RenderFrame(p_min,p_max,fill_col,true,(pIVar1->Style).FrameRounding);
      fVar6 = (local_70.x - pIVar1->FontSize) * 0.5;
      fVar7 = (local_70.y - pIVar1->FontSize) * 0.5;
      pos.y = local_40.Min.y + (float)(-(uint)(0.0 < fVar7) & (uint)fVar7);
      pos.x = local_40.Min.x + (float)(-(uint)(0.0 < fVar6) & (uint)fVar6);
      RenderArrow(this->DrawList,pos,local_68._0_4_,(ImGuiDir)local_58,1.0);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::ArrowButtonEx(const char* str_id, ImGuiDir dir, ImVec2 size, ImGuiButtonFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiID id = window->GetID(str_id);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    const float default_size = GetFrameHeight();
    ItemSize(size, (size.y >= default_size) ? g.Style.FramePadding.y : -1.0f);
    if (!ItemAdd(bb, id))
        return false;

    if (window->DC.ItemFlags & ImGuiItemFlags_ButtonRepeat)
        flags |= ImGuiButtonFlags_Repeat;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, flags);

    // Render
    const ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    const ImU32 text_col = GetColorU32(ImGuiCol_Text);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, bg_col, true, g.Style.FrameRounding);
    RenderArrow(window->DrawList, bb.Min + ImVec2(ImMax(0.0f, (size.x - g.FontSize) * 0.5f), ImMax(0.0f, (size.y - g.FontSize) * 0.5f)), text_col, dir);

    return pressed;
}